

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecVec.h
# Opt level: O2

void Vec_VecFree(Vec_Vec_t *p)

{
  int i;
  long lVar1;
  
  for (lVar1 = 0; lVar1 < p->nSize; lVar1 = lVar1 + 1) {
    if ((Vec_Ptr_t *)p->pArray[lVar1] != (Vec_Ptr_t *)0x0) {
      Vec_PtrFree((Vec_Ptr_t *)p->pArray[lVar1]);
    }
  }
  Vec_PtrFree((Vec_Ptr_t *)p);
  return;
}

Assistant:

static inline void Vec_VecFree( Vec_Vec_t * p )
{
    Vec_Ptr_t * vVec;
    int i;
    Vec_VecForEachLevel( p, vVec, i )
        if ( vVec ) Vec_PtrFree( vVec );
    Vec_PtrFree( (Vec_Ptr_t *)p );
}